

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_allocate_delete.c
# Opt level: O0

int test_kvtree_allocate_delete(void)

{
  long local_18;
  kvtree *kvtree;
  int rc;
  
  kvtree._4_4_ = 0;
  local_18 = kvtree_new();
  if (local_18 == 0) {
    kvtree._4_4_ = 1;
  }
  kvtree_delete(&local_18);
  if (local_18 != 0) {
    kvtree._4_4_ = 1;
  }
  return kvtree._4_4_;
}

Assistant:

int test_kvtree_allocate_delete(){
  int rc = TEST_PASS;

  kvtree* kvtree = kvtree_new();
  if (kvtree == NULL) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  if (kvtree != NULL) rc = TEST_FAIL;

  return rc;
}